

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O0

int dynlink_library_path(dynlink_name name,char *path,size_t *length)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long *in_RDX;
  char *in_RSI;
  dynlink_name_impl name_impl;
  size_t in_stack_ffffffffffffefd0;
  size_t *in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  char *in_stack_ffffffffffffefe8;
  undefined4 local_4;
  
  dynlink_impl_get_name
            (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
  iVar1 = portability_library_path
                    (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
  if (iVar1 == 0) {
    if (in_RDX == (long *)0x0) {
      sVar3 = strnlen(in_RSI,0x1000);
      portability_path_get_directory_inplace(in_RSI,sVar3 + 1);
    }
    else {
      sVar2 = portability_path_get_directory_inplace(in_RSI,*in_RDX + 1);
      *in_RDX = sVar2 - 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int dynlink_library_path(dynlink_name name, dynlink_library_path_str path, size_t *length)
{
	dynlink_name_impl name_impl;

	dynlink_impl_get_name(name, name_impl, PORTABILITY_PATH_SIZE);

	if (portability_library_path(name_impl, path, length) != 0)
	{
		return 1;
	}

	if (length != NULL)
	{
		*length = portability_path_get_directory_inplace(path, (*length) + 1) - 1;
	}
	else
	{
		(void)portability_path_get_directory_inplace(path, strnlen(path, sizeof(dynlink_library_path_str) / sizeof(char)) + 1);
	}

	return 0;
}